

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

shared_ptr<bytecode::CompiledFile> __thiscall
compiler::CompilerAstWalker::ConstructCompiledFile(CompilerAstWalker *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar5;
  Function local_88;
  vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_48;
  undefined1 local_29;
  
  plVar1 = *(long **)(in_RSI + 0x128);
  lVar2 = *plVar1;
  lVar3 = plVar1[1];
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            (&local_48,
             (vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)(plVar1 + 10));
  local_88.localsCount = (lVar3 - lVar2 >> 3) * -0x3333333333333333;
  local_88.argumentCount = 0;
  local_88.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_88.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_AstWalker)._vptr_AstWalker = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bytecode::CompiledFile,std::allocator<bytecode::CompiledFile>,bytecode::Function,std::vector<bytecode::Function,std::allocator<bytecode::Function>>&,std::vector<bytecode::ObjectConstructor,std::allocator<bytecode::ObjectConstructor>>&,std::vector<long,std::allocator<long>>&,std::vector<double,std::allocator<double>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->functions,(CompiledFile **)this,
             (allocator<bytecode::CompiledFile> *)&local_29,&local_88,
             (vector<bytecode::Function,_std::allocator<bytecode::Function>_> *)(in_RSI + 8),
             (vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *)
             (in_RSI + 0x20),(vector<long,_std::allocator<long>_> *)(in_RSI + 0x38),
             (vector<double,_std::allocator<double>_> *)(in_RSI + 0x88),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0xd8));
  _Var4._M_pi = extraout_RDX;
  if (local_88.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.byteCode.
                    super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.byteCode.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.byteCode.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_88.closures.
      super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.closures.
                    super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.closures.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.closures.
                          super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var4._M_pi = extraout_RDX_01;
  }
  if (local_48.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var4._M_pi = extraout_RDX_02;
  }
  sVar5.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar5.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> ConstructCompiledFile() noexcept {
    return std::make_shared<bytecode::CompiledFile>(
      bytecode::Function{ 0, this->ec->variables.size(), {}, this->ec->byteCode },
      this->functions,
      this->objects,
      this->intConstants,
      this->floatConstants,
      this->stringConstants
    );
  }